

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O0

void pzgeom::TPZQuadraticPyramid::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  double dVar1;
  double *pdVar2;
  long *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double col;
  int j;
  int i;
  TPZFNMatrix<39,_double> dphi;
  TPZFNMatrix<13,_double> phi;
  int ncol;
  int nrow;
  double in_stack_fffffffffffffca0;
  double in_stack_fffffffffffffca8;
  TPZFNMatrix<39,_double> *in_stack_fffffffffffffcb0;
  int local_304;
  int local_300;
  TPZFMatrix<double> *in_stack_fffffffffffffe30;
  TPZFMatrix<double> *in_stack_fffffffffffffe38;
  TPZVec<double> *in_stack_fffffffffffffe40;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3);
  (**(code **)(*in_RDX + 0x78))();
  TPZBaseMatrix::Rows(in_RDI);
  TPZBaseMatrix::Cols(in_RDI);
  TPZFNMatrix<13,_double>::TPZFNMatrix
            ((TPZFNMatrix<13,_double> *)in_stack_fffffffffffffcb0,(int64_t)in_stack_fffffffffffffca8
             ,(int64_t)in_stack_fffffffffffffca0);
  TPZFNMatrix<39,_double>::TPZFNMatrix
            (in_stack_fffffffffffffcb0,(int64_t)in_stack_fffffffffffffca8,
             (int64_t)in_stack_fffffffffffffca0);
  TShape<double>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  for (local_300 = 0; local_300 < 0xd; local_300 = local_300 + 1) {
    for (local_304 = 0; local_304 < 3; local_304 = local_304 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_304,(long)local_300);
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffca8,(int64_t)in_stack_fffffffffffffca0);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffca8,(int64_t)in_stack_fffffffffffffca0);
      *pdVar2 = extraout_XMM0_Qa * dVar1 + *pdVar2;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_304,(long)local_300);
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffca8,(int64_t)in_stack_fffffffffffffca0);
      in_stack_fffffffffffffca8 = *pdVar2;
      in_stack_fffffffffffffcb0 =
           (TPZFNMatrix<39,_double> *)
           TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffca8,(int64_t)in_stack_fffffffffffffca0);
      (in_stack_fffffffffffffcb0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)
           (extraout_XMM0_Qa_00 * in_stack_fffffffffffffca8 +
           (double)(in_stack_fffffffffffffcb0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                   super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_304,(long)local_300);
      in_stack_fffffffffffffca0 = col;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffca8,(int64_t)col);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffcb0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffca8,(int64_t)in_stack_fffffffffffffca0);
      *pdVar2 = in_stack_fffffffffffffca0 * dVar1 + *pdVar2;
    }
  }
  TPZFNMatrix<39,_double>::~TPZFNMatrix((TPZFNMatrix<39,_double> *)0x1831074);
  TPZFNMatrix<13,_double>::~TPZFNMatrix((TPZFNMatrix<13,_double> *)0x1831081);
  return;
}

Assistant:

void TPZQuadraticPyramid::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
    
    gradx.Resize(3,3);
    gradx.Zero();
    int nrow = nodes.Rows();
    int ncol = nodes.Cols();
#ifdef PZDEBUG
    if(nrow != 3 || ncol  != 13){
        std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
        std::cout << "nodes matrix must be 3x13." << std::endl;
        DebugStop();
    }
    
#endif
    TPZFNMatrix<13,T> phi(NNodes,1);
    TPZFNMatrix<39,T> dphi(3,NNodes);
    TShape(loc,phi,dphi);
    for(int i = 0; i < NNodes; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
            gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
            gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
            
        }
    }
    
}